

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O2

void tree_print_snode(lyout *out,int level,uint16_t max_name_len,lys_node *node,int mask,
                     lys_node *aug_parent,int subtree,tp_opts *opts)

{
  long lVar1;
  lys_ext_instance *plVar2;
  lys_ext_instance **pplVar3;
  byte bVar4;
  uint16_t max_name_len_00;
  LYS_NODE LVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  lys_node *plVar9;
  lys_module *plVar10;
  lys_module *plVar11;
  lys_node *plVar12;
  size_t sVar13;
  lyout *out_00;
  size_t sVar14;
  char *pcVar15;
  byte bVar16;
  LYS_NODE LVar17;
  lys_iffeature *iff2;
  uint8_t iff1_size;
  undefined6 in_register_00000012;
  ulong uVar18;
  short sVar19;
  uint uVar20;
  char *pcVar21;
  lys_iffeature *iff1;
  ly_ctx *ctx;
  uint8_t iff2_size;
  lys_node **pplVar22;
  ushort uVar23;
  bool bVar24;
  long local_78;
  lys_node *local_68;
  char *text_str;
  lys_node *local_58;
  lys_node *local_50;
  LYS_NODE local_44;
  lys_node *local_40;
  int local_38;
  int local_34;
  
  uVar20 = 0;
  if (node->parent != (lys_node *)0x0) {
    uVar20 = (uint)(node->parent->nodetype == LYS_AUGMENT);
  }
  local_50 = aug_parent;
  plVar9 = lys_is_disabled(node,uVar20);
  if (plVar9 != (lys_node *)0x0) {
    return;
  }
  LVar17 = node->nodetype;
  if ((LVar17 & mask) == LYS_UNKNOWN) {
    return;
  }
  if (((LVar17 & mask & (LYS_OUTPUT|LYS_INPUT|LYS_CASE)) != LYS_UNKNOWN) &&
     ((node->flags & 0x40) != 0)) {
    if (LVar17 != LYS_CASE) {
      return;
    }
    plVar9 = lys_is_disabled(node->child,0);
    if (plVar9 != (lys_node *)0x0) {
      return;
    }
    LVar17 = node->nodetype;
  }
  LVar5 = LVar17 & mask;
  local_44 = mask;
  local_40 = node;
  if (LVar5 != LYS_ANYXML) {
    level = level;
    if ((LVar5 != LYS_GROUPING) && ((LVar5 != LYS_USES || ((opts->options & 4) != 0))))
    goto LAB_0018be04;
    goto LAB_0018c9be;
  }
  plVar9 = lys_parent(node);
  if ((plVar9 == (lys_node *)0x0) &&
     ((iVar6 = strcmp(node->name,"config"), iVar6 == 0 &&
      (iVar6 = strcmp(node->module->name,"ietf-netconf"), iVar6 == 0)))) {
    return;
  }
LAB_0018be04:
  local_34 = level;
  local_38 = tree_print_indent(out,level,opts);
  pcVar21 = "o";
  if ((node->flags & 0x20) == 0) {
    pcVar21 = "+";
  }
  pcVar15 = "x";
  if ((node->flags & 0x10) == 0) {
    pcVar15 = pcVar21;
  }
  iVar6 = ly_print(out,"%s--",pcVar15);
  LVar17 = node->nodetype;
  text_str._4_4_ = (int)CONCAT62(in_register_00000012,max_name_len);
  if (LVar17 == LYS_CASE) {
    pcVar21 = ":(";
LAB_0018bec3:
    iVar7 = ly_print(out,pcVar21);
    local_58 = (lys_node *)CONCAT44(local_58._4_4_,iVar7);
  }
  else {
    if (LVar17 == LYS_NOTIF) {
      pcVar21 = "-n ";
      goto LAB_0018bec3;
    }
    if (LVar17 == LYS_ACTION) {
LAB_0018be7c:
      pcVar21 = "-x ";
      goto LAB_0018bec3;
    }
    if (LVar17 == LYS_USES) {
      pcVar21 = "-u ";
      goto LAB_0018bec3;
    }
    if (LVar17 == LYS_RPC) goto LAB_0018be7c;
    if (opts->spec_config == 2) {
      pcVar21 = "ro ";
LAB_0018c4c1:
      iVar7 = ly_print(out,pcVar21);
    }
    else {
      if (opts->spec_config == 1) {
        pcVar21 = "-w ";
        goto LAB_0018c4c1;
      }
      pcVar21 = "ro";
      if ((node->flags & 2) == 0) {
        pcVar21 = "--";
      }
      pcVar15 = "rw";
      if ((node->flags & 1) == 0) {
        pcVar15 = pcVar21;
      }
      iVar7 = ly_print(out,"%s ",pcVar15);
    }
    if (node->nodetype == LYS_CHOICE) {
      iVar8 = ly_print(out,"(");
      iVar7 = iVar7 + iVar8;
    }
    local_58 = (lys_node *)CONCAT44(local_58._4_4_,iVar7);
  }
  plVar10 = lys_node_module(node);
  plVar11 = lys_main_module(opts->module);
  if (plVar11 == plVar10) {
    uVar20 = 0;
  }
  else {
    uVar20 = ly_print(out,"%s:",
                      *(undefined8 *)(plVar10->padding2 + (ulong)(opts->options & 1) * 8 + -0x3a));
    uVar20 = uVar20 & 0xffff;
  }
  iVar6 = iVar6 + local_38;
  iVar7 = ly_print(out,node->name);
  iVar7 = iVar7 + uVar20;
  LVar17 = node->nodetype & local_44;
  pcVar21 = "*";
  switch(LVar17) {
  case LYS_CONTAINER:
    lVar1._0_2_ = node[1].flags;
    lVar1._2_1_ = node[1].ext_size;
    lVar1._3_1_ = node[1].iffeature_size;
    lVar1._4_1_ = node[1].padding[0];
    lVar1._5_1_ = node[1].padding[1];
    lVar1._6_1_ = node[1].padding[2];
    lVar1._7_1_ = node[1].padding[3];
    if (lVar1 != 0) {
      pcVar21 = "!";
      goto switchD_0018bf86_caseD_8;
    }
    break;
  case LYS_CHOICE:
    iVar8 = ly_print(out,")");
    iVar7 = iVar7 + iVar8;
    bVar4 = (byte)node->flags;
joined_r0x0018bf69:
    if ((bVar4 & 0x40) == 0) {
      pcVar21 = "?";
      goto switchD_0018bf86_caseD_8;
    }
    break;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
    break;
  case LYS_LEAF:
    if ((node->flags & 0x40) == 0) {
      pcVar21 = "?";
      plVar9 = node;
      do {
        plVar9 = lys_parent(plVar9);
        if (plVar9 == (lys_node *)0x0) goto switchD_0018bf86_caseD_8;
      } while (plVar9->nodetype == LYS_USES);
      if (plVar9->nodetype != LYS_LIST) goto switchD_0018bf86_caseD_8;
      uVar18 = 0;
      do {
        if (plVar9->padding[2] == uVar18) goto switchD_0018bf86_caseD_8;
        lVar1 = uVar18 * 8;
        uVar18 = uVar18 + 1;
      } while (*(lys_node **)(*(long *)&plVar9[1].flags + lVar1) != node);
    }
    break;
  default:
    if (LVar17 != LYS_LIST) {
      if (LVar17 != LYS_ANYXML) {
        if (LVar17 == LYS_CASE) {
          pcVar21 = ")";
          goto switchD_0018bf86_caseD_8;
        }
        if (LVar17 != LYS_ANYDATA) break;
      }
      bVar4 = (byte)node->flags;
      goto joined_r0x0018bf69;
    }
  case LYS_LEAFLIST:
switchD_0018bf86_caseD_8:
    iVar8 = ly_print(out,pcVar21);
    iVar7 = iVar7 + iVar8;
  }
  iVar6 = iVar6 + (int)local_58;
  if (subtree == 0) {
    if (local_34 < 0x40) {
      bVar16 = (byte)local_34;
      bVar4 = bVar16 & 0x3f;
      opts->indent = opts->indent & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      local_38 = iVar6;
      if ((((node->nodetype == LYS_CASE) || (plVar9 = lys_parent(node), plVar9 == (lys_node *)0x0))
          || (plVar9 = lys_parent(node), (plVar9->nodetype & (LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN))
         || (node->next == (lys_node *)0x0)) {
        bVar24 = false;
        plVar9 = local_50;
      }
      else {
        plVar12 = lys_parent(node->next);
        plVar9 = local_50;
        if (plVar12 == (lys_node *)0x0) {
          bVar24 = false;
        }
        else {
          plVar12 = lys_parent(local_40->next);
          bVar24 = plVar12->nodetype == LYS_CHOICE;
        }
      }
      node = local_40;
      iVar8 = tree_sibling_is_valid_child(local_40,0,opts->module,plVar9,local_40->nodetype);
      iVar6 = local_38;
      if ((!bVar24) && (iVar8 != 0)) {
        opts->indent = opts->indent | 1L << (bVar16 & 0x3f);
      }
    }
    else {
      ly_log(node->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
            );
    }
  }
  iVar6 = iVar6 + iVar7;
  local_34 = local_34 + 1;
  LVar17 = node->nodetype & local_44;
  sVar19 = (short)text_str._4_4_;
  if (LVar17 == LYS_LEAF) {
LAB_0018c168:
    if (sVar19 == 0) {
      local_38 = iVar6;
      __assert_fail("max_name_len",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
                    ,0x25c,
                    "void tree_print_snode(struct lyout *, int, uint16_t, const struct lys_node *, int, const struct lys_node *, int, tp_opts *)"
                   );
    }
    local_50 = (lys_node *)
               CONCAT44(local_50._4_4_,
                        CONCAT31((int3)((uint)(text_str._4_4_ - iVar7) >> 8),
                                 (char)(text_str._4_4_ - iVar7) + '\x03'));
    uVar20 = opts->options;
    plVar10 = (lys_module *)node[1].iffeature[1].features;
    if ((*(int *)&node[1].ref == 9) && (node[1].ext[6] == (lys_ext_instance *)0x0)) {
      if ((uVar20 & 8) == 0) {
        plVar11 = node[1].module;
        if ((uVar20 & 1) == 0) {
          local_38 = iVar6;
          sVar13 = strlen((char *)plVar11);
          pcVar21 = (char *)malloc((long)((int)sVar13 + 4));
          iVar6 = local_38;
          if (pcVar21 == (char *)0x0) {
            uVar23 = 0;
            ly_log(plVar10->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "tree_print_type");
            node = local_40;
          }
          else {
            uVar23 = (short)sVar13 + 3;
            sprintf(pcVar21,"-> %s",plVar11);
            local_68 = (lys_node *)lydict_insert_zc(plVar10->ctx,pcVar21);
            node = local_40;
            local_58 = local_68;
          }
        }
        else {
          local_38 = iVar6;
          pcVar21 = transform_json2schema(plVar10,(char *)plVar11);
          sVar13 = strlen(pcVar21);
          pcVar15 = (char *)malloc((long)((int)sVar13 + 4));
          if (pcVar15 == (char *)0x0) {
            ctx = plVar10->ctx;
LAB_0018c6f6:
            uVar23 = 0;
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","tree_print_type");
            node = local_40;
            iVar6 = local_38;
          }
          else {
            uVar23 = (short)sVar13 + 3;
            sprintf(pcVar15,"-> %s",pcVar21);
            local_68 = (lys_node *)lydict_insert_zc(plVar10->ctx,pcVar15);
            local_58 = local_68;
            lydict_remove(plVar10->ctx,pcVar21);
            node = local_40;
            iVar6 = local_38;
          }
        }
      }
      else {
        local_38 = iVar6;
        local_58 = (lys_node *)lydict_insert(plVar10->ctx,"leafref",7);
        sVar13 = 7;
LAB_0018c1eb:
        uVar23 = (ushort)sVar13;
        iVar6 = local_38;
        local_68 = local_58;
      }
    }
    else {
      local_38 = iVar6;
      iVar6 = lys_type_is_local((lys_type *)&node[1].ref);
      if (iVar6 != 0) {
        plVar2 = *node[1].ext;
        sVar13 = strlen((char *)plVar2);
        local_58 = (lys_node *)lydict_insert(plVar10->ctx,(char *)plVar2,(long)(int)sVar13);
        goto LAB_0018c1eb;
      }
      pplVar3 = node[1].ext;
      pcVar21 = (char *)pplVar3[6]->parent;
      if ((uVar20 & 1) == 0) {
        sVar13 = strlen(pcVar21);
        plVar2 = *pplVar3;
        sVar14 = strlen((char *)plVar2);
        local_78 = sVar13 + sVar14 + 1;
        pcVar15 = (char *)malloc((local_78 << 0x20) + 0x100000000 >> 0x20);
        if (pcVar15 == (char *)0x0) {
          ctx = plVar10->ctx;
          goto LAB_0018c6f6;
        }
        sprintf(pcVar15,"%s:%s",pcVar21,plVar2);
        local_58 = (lys_node *)lydict_insert_zc(plVar10->ctx,pcVar15);
      }
      else {
        local_58 = (lys_node *)transform_module_name2import_prefix(plVar10,pcVar21);
        sVar13 = strlen((char *)local_58);
        plVar2 = *node[1].ext;
        sVar14 = strlen((char *)plVar2);
        local_78 = sVar13 + sVar14 + 1;
        pcVar21 = (char *)malloc((local_78 << 0x20) + 0x100000000 >> 0x20);
        if (pcVar21 == (char *)0x0) {
          uVar23 = 0;
          ly_log(plVar10->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","tree_print_type")
          ;
          node = local_40;
          iVar6 = local_38;
          goto LAB_0018c722;
        }
        sprintf(pcVar21,"%s:%s",local_58,plVar2);
        local_58 = (lys_node *)lydict_insert_zc(plVar10->ctx,pcVar21);
      }
      uVar23 = (ushort)local_78;
      node = local_40;
      iVar6 = local_38;
      local_68 = local_58;
    }
LAB_0018c722:
    iVar7 = tree_print_wrap(out,local_34,iVar6,(uint8_t)local_50,uVar23 & 0xff,opts);
    plVar9 = local_58;
    iVar6 = ly_print(out,(char *)local_58);
    iVar6 = iVar6 + iVar7;
    lydict_remove(opts->module->ctx,(char *)plVar9);
  }
  else if (LVar17 == LYS_ANYDATA) {
    if (sVar19 == 0) {
      __assert_fail("max_name_len",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
                    ,0x264,
                    "void tree_print_snode(struct lyout *, int, uint16_t, const struct lys_node *, int, const struct lys_node *, int, tp_opts *)"
                   );
    }
    iVar7 = tree_print_wrap(out,local_34,iVar6,((char)text_str._4_4_ - (char)iVar7) + '\x03',7,opts)
    ;
    pcVar21 = "anydata";
LAB_0018c25b:
    iVar6 = ly_print(out,pcVar21);
    iVar6 = iVar6 + iVar7;
  }
  else if (LVar17 == LYS_LIST) {
    local_50 = (lys_node *)(ulong)node->padding[2];
    if (local_50 != (lys_node *)0x0) {
      local_58 = *(lys_node **)&node[1].flags;
      out_00 = (lyout *)malloc(0x40);
      if (out_00 == (lyout *)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","tree_print_keys");
      }
      else {
        out_00->type = LYOUT_MEMORY;
        (out_00->method).f = (FILE *)0x0;
        (out_00->method).mem.len = 0;
        (out_00->method).mem.size = 0;
        local_38 = iVar6;
        iVar7 = ly_print(out_00,"[");
        plVar12 = local_50;
        for (plVar9 = (lys_node *)0x1; (long)plVar9 - (long)plVar12 != 1;
            plVar9 = (lys_node *)((long)&plVar9->name + 1)) {
          pcVar21 = "]";
          if (plVar9 < local_50) {
            pcVar21 = " ";
          }
          iVar6 = ly_print(out_00,"%s%s",
                           **(undefined8 **)(local_58->padding + (long)plVar9 * 8 + -0x24),pcVar21);
          iVar7 = iVar7 + iVar6;
        }
        plVar9 = (lys_node *)lydict_insert_zc(opts->module->ctx,(out_00->method).mem.buf);
        local_68 = plVar9;
        free(out_00);
        node = local_40;
        iVar6 = local_38;
        if ((char)iVar7 != '\0') {
          iVar6 = tree_print_wrap(out,local_34,local_38,'\x01',(ushort)iVar7 & 0xff,opts);
          iVar7 = ly_print(out,(char *)plVar9);
          lydict_remove(opts->module->ctx,(char *)plVar9);
          node = local_40;
          iVar6 = iVar7 + iVar6;
        }
      }
    }
  }
  else {
    if (LVar17 == LYS_ANYXML) {
      if (sVar19 == 0) {
        __assert_fail("max_name_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
                      ,0x26a,
                      "void tree_print_snode(struct lyout *, int, uint16_t, const struct lys_node *, int, const struct lys_node *, int, tp_opts *)"
                     );
      }
      iVar7 = tree_print_wrap(out,local_34,iVar6,((char)text_str._4_4_ - (char)iVar7) + '\x03',6,
                              opts);
      pcVar21 = "anyxml";
      goto LAB_0018c25b;
    }
    if (LVar17 == LYS_LEAFLIST) goto LAB_0018c168;
  }
  iVar8 = local_34;
  iVar7 = text_str._4_4_;
  if ((opts->options & 1) == 0) {
    LVar17 = node->nodetype & local_44;
    if (LVar17 == LYS_CHOICE) {
      pcVar21 = node[1].name;
      node = local_40;
      local_38 = iVar6;
      if (pcVar21 != (char *)0x0) {
        sVar13 = strlen(*(char **)pcVar21);
        iVar8 = tree_print_wrap(out,iVar8,local_38,'\x01',(short)sVar13 + 2,opts);
        iVar6 = ly_print(out,"<%s>",*(undefined8 *)pcVar21);
        iVar6 = iVar6 + iVar8;
        node = local_40;
      }
    }
    else if ((LVar17 == LYS_LEAF) &&
            (plVar9 = node[1].prev, local_68 = plVar9, plVar9 != (lys_node *)0x0)) {
      sVar13 = strlen((char *)plVar9);
      iVar8 = tree_print_wrap(out,local_34,iVar6,'\x01',(short)sVar13 + 2,opts);
      iVar6 = ly_print(out,"<%s>",plVar9);
      iVar6 = iVar6 + iVar8;
      node = local_40;
    }
  }
  mask = local_44;
  max_name_len = (uint16_t)iVar7;
  LVar17 = node->nodetype & local_44;
  if (((((LVar17 - LYS_CONTAINER < 0x40) &&
        ((0x800000008000808bU >> ((ulong)(LVar17 - LYS_CONTAINER) & 0x3f) & 1) != 0)) ||
       (LVar17 == LYS_NOTIF)) || ((LVar17 == LYS_RPC || (LVar17 == LYS_USES)))) ||
     ((LVar17 == LYS_ANYDATA || (LVar17 == LYS_ACTION)))) {
    plVar9 = node->parent;
    if ((plVar9 == (lys_node *)0x0) || (plVar9->nodetype != LYS_AUGMENT)) {
      iff1 = node->iffeature;
      iff1_size = node->iffeature_size;
      iff2 = (lys_iffeature *)0x0;
      iff2_size = '\0';
    }
    else {
      iff1 = node->iffeature;
      iff1_size = node->iffeature_size;
      iff2 = plVar9->iffeature;
      iff2_size = plVar9->iffeature_size;
    }
    iVar7 = tree_print_features(out,iff1,iff1_size,iff2,iff2_size,opts,(char **)&local_68);
    if ((char)iVar7 != '\0') {
      tree_print_wrap(out,local_34,iVar6,'\x01',(ushort)iVar7 & 0xff,opts);
      ly_print(out,(char *)local_68);
      lydict_remove(opts->module->ctx,(char *)local_68);
    }
  }
  ly_print(out,"\n");
  if (subtree == 1) {
    return;
  }
  LVar17 = node->nodetype;
  LVar5 = LVar17 & mask;
  level = local_34;
  if (LVar5 == LYS_NOTIF) {
LAB_0018c8f8:
    iVar6 = 2;
LAB_0018c9b9:
    opts->spec_config = iVar6;
  }
  else {
    if (LVar5 == LYS_INPUT) {
      iVar6 = 1;
      goto LAB_0018c9b9;
    }
    if (LVar5 == LYS_USES) {
      return;
    }
    if (LVar5 == LYS_OUTPUT) goto LAB_0018c8f8;
  }
LAB_0018c9be:
  plVar9 = local_40;
  LVar17 = LVar17 & mask;
  switch(LVar17) {
  case LYS_CONTAINER:
switchD_0018ca90_caseD_1:
    plVar12 = local_40->child;
    iVar6 = 0xd0bf;
    iVar7 = 0xd0bf;
    break;
  case LYS_CHOICE:
    plVar12 = local_40->child;
    iVar6 = 0x807d;
    iVar7 = 0x807d;
    break;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
switchD_0018ca90_caseD_3:
    ly_log(local_40->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
           ,0x2f2);
  case LYS_LEAF:
  case LYS_LEAFLIST:
    goto switchD_0018ca90_caseD_4;
  default:
    if (LVar17 == LYS_LIST) goto switchD_0018ca90_caseD_1;
    if (LVar17 == LYS_ANYXML) goto switchD_0018ca90_caseD_4;
    if ((LVar17 == LYS_CASE) || (LVar17 == LYS_NOTIF)) {
LAB_0018cac2:
      plVar12 = local_40->child;
      iVar6 = 0x903f;
      iVar7 = 0x903f;
      break;
    }
    iVar6 = 0x600;
    max_name_len_00 = 0;
    if (LVar17 != LYS_RPC) {
      if ((LVar17 == LYS_INPUT) || (LVar17 == LYS_OUTPUT)) goto LAB_0018cac2;
      if (LVar17 == LYS_GROUPING) goto switchD_0018ca90_caseD_1;
      if (LVar17 == LYS_USES) {
        iVar6 = 0xd0bf;
        max_name_len_00 = max_name_len;
      }
      else {
        max_name_len_00 = 0;
        iVar6 = 0x600;
        if (LVar17 != LYS_ACTION) {
          if (LVar17 == LYS_ANYDATA) goto switchD_0018ca90_caseD_4;
          goto switchD_0018ca90_caseD_3;
        }
      }
    }
    goto LAB_0018cb0e;
  }
  max_name_len_00 = tree_get_max_name_len(plVar12,(lys_node *)0x0,iVar7,opts);
LAB_0018cb0e:
  pplVar22 = &plVar9->child;
  while (plVar9 = *pplVar22, plVar9 != (lys_node *)0x0) {
    if ((((opts->module->field_0x40 & 1) == 0) || (plVar9->parent == local_40)) ||
       (plVar9->module == opts->module)) {
      tree_print_snode(out,level,max_name_len_00,plVar9,iVar6,(lys_node *)0x0,0,opts);
    }
    pplVar22 = &plVar9->next;
  }
switchD_0018ca90_caseD_4:
  local_44 = local_44 & local_40->nodetype;
  if (((local_44 == LYS_NOTIF) || (local_44 == LYS_OUTPUT)) || (local_44 == LYS_INPUT)) {
    opts->spec_config = 0;
  }
  return;
}

Assistant:

static void
tree_print_snode(struct lyout *out, int level, uint16_t max_name_len, const struct lys_node *node, int mask,
                 const struct lys_node *aug_parent, int subtree, tp_opts *opts)
{
    struct lys_node *sub;
    int line_len, node_len, child_mask;
    uint8_t text_len, text_indent;
    uint16_t max_child_len;
    const char *text_str;

    /* disabled/not printed node */
    if (lys_is_disabled(node, (node->parent && node->parent->nodetype == LYS_AUGMENT) ? 1 : 0) || !(node->nodetype & mask)) {
        return;
    }

    /* implicit input/output/case */
    if (((node->nodetype & mask) & (LYS_INPUT | LYS_OUTPUT | LYS_CASE)) && (node->flags & LYS_IMPLICIT)) {
        if ((node->nodetype != LYS_CASE) || lys_is_disabled(node->child, 0)) {
            return;
        }
    }

    /* special uses and grouping handling */
    switch (node->nodetype & mask) {
    case LYS_USES:
        if (opts->options & LYS_OUTOPT_TREE_USES) {
            break;
        }
        /* fallthrough */
    case LYS_GROUPING:
        goto print_children;
    case LYS_ANYXML:
        if (!lys_parent(node) && !strcmp(node->name, "config") && !strcmp(node->module->name, "ietf-netconf")) {
            /* node added by libyang, not actually in the model */
            return;
        }
        break;
    default:
        break;
    }

    /* print indent */
    line_len = tree_print_indent(out, level, opts);
    /* print status */
    line_len += ly_print(out, "%s--", (node->flags & LYS_STATUS_DEPRC ? "x" : (node->flags & LYS_STATUS_OBSLT ? "o" : "+")));
    /* print config flags (or special opening for case, choice) */
    line_len += tree_print_config(out, node, opts->spec_config);
    /* print optionally prefix */
    node_len = tree_print_prefix(out, node, opts);
    /* print name */
    node_len += ly_print(out, node->name);

    /* print one-character opts */
    switch (node->nodetype & mask) {
    case LYS_LEAF:
        if (!(node->flags & LYS_MAND_TRUE) && !tree_leaf_is_mandatory(node)) {
            node_len += ly_print(out, "?");
        }
        break;
    case LYS_ANYDATA:
    case LYS_ANYXML:
        if (!(node->flags & LYS_MAND_TRUE)) {
            node_len += ly_print(out, "?");
        }
        break;
    case LYS_CONTAINER:
        if (((struct lys_node_container *)node)->presence) {
            node_len += ly_print(out, "!");
        }
        break;
    case LYS_LIST:
    case LYS_LEAFLIST:
        node_len += ly_print(out, "*");
        break;
    case LYS_CASE:
        /* kinda shady, but consistent in a way */
        node_len += ly_print(out, ")");
        break;
    case LYS_CHOICE:
        node_len += ly_print(out, ")");
        if (!(node->flags & LYS_MAND_TRUE)) {
            node_len += ly_print(out, "?");
        }
        break;
    default:
        break;
    }
    line_len += node_len;

    /**
     * wrapped print
     */

    /* learn next level indent (there is never a sibling for subtree) */
    ++level;
    if (!subtree) {
        tree_next_indent(level, node, aug_parent, opts);
    }

    /* print type/keys */
    switch (node->nodetype & mask) {
    case LYS_LEAF:
    case LYS_LEAFLIST:
        assert(max_name_len);
        text_indent = LY_TREE_TYPE_INDENT + (uint8_t)(max_name_len - node_len);
        text_len = tree_print_type(out, &((struct lys_node_leaf *)node)->type, opts->options, &text_str);
        line_len = tree_print_wrap(out, level, line_len, text_indent, text_len, opts);
        line_len += ly_print(out, text_str);
        lydict_remove(opts->module->ctx, text_str);
        break;
    case LYS_ANYDATA:
        assert(max_name_len);
        text_indent = LY_TREE_TYPE_INDENT + (uint8_t)(max_name_len - node_len);
        line_len = tree_print_wrap(out, level, line_len, text_indent, 7, opts);
        line_len += ly_print(out, "anydata");
        break;
    case LYS_ANYXML:
        assert(max_name_len);
        text_indent = LY_TREE_TYPE_INDENT + (uint8_t)(max_name_len - node_len);
        line_len = tree_print_wrap(out, level, line_len, text_indent, 6, opts);
        line_len += ly_print(out, "anyxml");
        break;
    case LYS_LIST:
        text_len = tree_print_keys(out, ((struct lys_node_list *)node)->keys, ((struct lys_node_list *)node)->keys_size,
                                   opts, &text_str);
        if (text_len) {
            line_len = tree_print_wrap(out, level, line_len, 1, text_len, opts);
            line_len += ly_print(out, text_str);
            lydict_remove(opts->module->ctx, text_str);
        }
        break;
    default:
        break;
    }

    /* print default */
    if (!(opts->options & LYS_OUTOPT_TREE_RFC)) {
        switch (node->nodetype & mask) {
        case LYS_LEAF:
            text_str = ((struct lys_node_leaf *)node)->dflt;
            if (text_str) {
                line_len = tree_print_wrap(out, level, line_len, 1, 2 + strlen(text_str), opts);
                line_len += ly_print(out, "<%s>", text_str);
            }
            break;
        case LYS_CHOICE:
            sub = ((struct lys_node_choice *)node)->dflt;
            if (sub) {
                line_len = tree_print_wrap(out, level, line_len, 1, 2 + strlen(sub->name), opts);
                line_len += ly_print(out, "<%s>", sub->name);
            }
            break;
        default:
            break;
        }
    }

    /* print if-features */
    switch (node->nodetype & mask) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_CHOICE:
    case LYS_CASE:
    case LYS_ANYDATA:
    case LYS_ANYXML:
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_RPC:
    case LYS_ACTION:
    case LYS_NOTIF:
    case LYS_USES:
        if (node->parent && (node->parent->nodetype == LYS_AUGMENT)) {
            /* if-features from an augment are de facto inherited */
            text_len = tree_print_features(out, node->iffeature, node->iffeature_size,
                                           node->parent->iffeature, node->parent->iffeature_size, opts, &text_str);
        } else {
            text_len = tree_print_features(out, node->iffeature, node->iffeature_size, NULL, 0, opts, &text_str);
        }
        if (text_len) {
            line_len = tree_print_wrap(out, level, line_len, 1, text_len, opts);
            line_len += ly_print(out, text_str);
            lydict_remove(opts->module->ctx, text_str);
        }
        break;
    default:
        /* only grouping */
        break;
    }

    /* this node is finished printing */
    ly_print(out, "\n");

    if ((subtree == 1) || ((node->nodetype & mask) == LYS_USES)) {
        /* we are printing subtree parents, finish here (or uses option) */
        return;
    }

    /* set special config flag */
    switch (node->nodetype & mask) {
    case LYS_INPUT:
        opts->spec_config = 1;
        break;
    case LYS_OUTPUT:
    case LYS_NOTIF:
        opts->spec_config = 2;
        break;
    default:
        break;
    }

print_children:
    /* set child mask and learn the longest child name (needed only if a child can have type) */
    switch (node->nodetype & mask) {
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYDATA:
    case LYS_ANYXML:
        child_mask = 0;
        max_child_len = 0;
        break;
    case LYS_RPC:
    case LYS_ACTION:
        child_mask = LYS_INPUT | LYS_OUTPUT;
        max_child_len = 0;
        break;
    case LYS_CHOICE:
        child_mask = LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA;
        max_child_len = tree_get_max_name_len(node->child, NULL, child_mask, opts);
        break;
    case LYS_CASE:
    case LYS_NOTIF:
        child_mask = LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_USES;
        max_child_len = tree_get_max_name_len(node->child, NULL, child_mask, opts);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        child_mask = LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_USES;
        max_child_len = tree_get_max_name_len(node->child, NULL, child_mask, opts);
        break;
    case LYS_USES:
        child_mask = LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_USES | LYS_ACTION | LYS_NOTIF;
        /* inherit the name length from the parent, it does not change */
        max_child_len = max_name_len;
        break;
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_GROUPING:
        child_mask = LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_USES | LYS_ACTION | LYS_NOTIF;
        max_child_len = tree_get_max_name_len(node->child, NULL, child_mask, opts);
        break;
    default:
        child_mask = 0;
        max_child_len = 0;
        LOGINT(node->module->ctx);
        break;
    }

    /* print descendants (children) */
    if (child_mask) {
        LY_TREE_FOR(node->child, sub) {
            /* submodule, foreign augments */
            if (opts->module->type && (sub->parent != node) && (sub->module != opts->module)) {
                continue;
            }
            tree_print_snode(out, level, max_child_len, sub, child_mask, NULL, 0, opts);
        }
    }

    /* reset special config flag */
    switch (node->nodetype & mask) {
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        opts->spec_config = 0;
        break;
    default:
        break;
    }
}